

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadArenaString
          (EpsCopyInputStream *this,char *ptr,ArenaStringPtr *s,Arena *arena)

{
  byte bVar1;
  string *s_00;
  uint size;
  char *pcVar2;
  pair<const_char_*,_int> pVar3;
  
  if (arena == (Arena *)0x0) {
    ReadArenaString((EpsCopyInputStream *)&stack0xffffffffffffffc8);
  }
  else {
    bVar1 = *ptr;
    size = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar3 = ReadSizeFallback(ptr,(uint)bVar1);
      pcVar2 = pVar3.first;
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      size = pVar3.second;
    }
    else {
      pcVar2 = ptr + 1;
    }
    s_00 = (string *)ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
    (s_00->_M_dataplus)._M_p = (pointer)&s_00->field_2;
    s_00->_M_string_length = 0;
    (s_00->field_2)._M_local_buf[0] = '\0';
    if (((ulong)s_00 & 3) == 0) {
      (s->tagged_ptr_).ptr_ = (void *)((ulong)s_00 | 3);
      pcVar2 = ReadString(this,pcVar2,size,s_00);
      return pcVar2;
    }
  }
  ReadArenaString();
}

Assistant:

const char* EpsCopyInputStream::ReadArenaString(const char* ptr,
                                                ArenaStringPtr* s,
                                                Arena* arena) {
  ScopedCheckPtrInvariants check(&s->tagged_ptr_);
  ABSL_DCHECK(arena != nullptr);

  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;

  auto* str = s->NewString(arena);
  ptr = ReadString(ptr, size, str);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ptr;
}